

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int2str.hpp
# Opt level: O2

char * int2str::impl::detail<10000ull>::convert<char*>(number_t x,char *iter)

{
  char *pcVar1;
  
  if (x < 10000) {
    pcVar1 = detail<1000ull>::convert<char*>(x,iter);
    return pcVar1;
  }
  pcVar1 = convert_step<char*>(x,iter);
  return pcVar1;
}

Assistant:

inline static Iter convert(number_t x, Iter iter)
    {
        if (N > x)
            return detail<N / 10u>::convert(x, iter);
        return detail<N>::convert_step(x, iter);
    }